

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O3

int __thiscall GeneticAlgorithm::init(GeneticAlgorithm *this,EVP_PKEY_CTX *ctx)

{
  time_t tVar1;
  pointer __s;
  __node_base _Var2;
  pointer extraout_RAX;
  pointer pEVar3;
  int iVar4;
  vector<CacheServer_*,_std::allocator<CacheServer_*>_> *in_RDX;
  GeneticAlgorithm *pGVar5;
  pointer pEVar6;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_float>,_false>_>_>
  _Stack_118;
  pointer pEStack_110;
  int iStack_108;
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_100;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_c8;
  float fStack_90;
  GeneticAlgorithm *pGStack_88;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_38;
  
  std::vector<CacheServer_*,_std::allocator<CacheServer_*>_>::operator=
            (&(this->dataCenter).caches,in_RDX);
  std::vector<Endpoint,_std::allocator<Endpoint>_>::operator=
            (&(this->dataCenter).endpoint,
             (vector<Endpoint,_std::allocator<Endpoint>_> *)(in_RDX + 1));
  std::vector<Video,_std::allocator<Video>_>::operator=
            (&(this->dataCenter).videos,(vector<Video,_std::allocator<Video>_> *)(in_RDX + 2));
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  findNumberOfRequests(this);
  __s = (pointer)operator_new(0x2580);
  memset(__s,0,0x2580);
  local_38.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->population).
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->population).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __s + 400;
  local_38.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->population).
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->population).
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->population).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  (this->population).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = __s + 400;
  local_58.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_38);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_58);
  pGVar5 = this;
  generateInitialPopulation(this,200);
  pEVar6 = (pGVar5->dataCenter).endpoint.super__Vector_base<Endpoint,_std::allocator<Endpoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (pGVar5->dataCenter).endpoint.super__Vector_base<Endpoint,_std::allocator<Endpoint>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar6 != pEVar3) {
    pEStack_110 = pEVar3;
    pGStack_88 = this;
    do {
      iStack_108 = pEVar6->id;
      _Stack_100._M_buckets = (__buckets_ptr)0x0;
      _Stack_100._M_bucket_count = (pEVar6->cacheLatency)._M_h._M_bucket_count;
      _Stack_100._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      _Stack_100._M_element_count = (pEVar6->cacheLatency)._M_h._M_element_count;
      _Stack_100._M_rehash_policy._M_max_load_factor =
           (pEVar6->cacheLatency)._M_h._M_rehash_policy._M_max_load_factor;
      _Stack_100._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pEVar6->cacheLatency)._M_h._M_rehash_policy.field_0x4;
      _Stack_100._M_rehash_policy._M_next_resize =
           (pEVar6->cacheLatency)._M_h._M_rehash_policy._M_next_resize;
      _Stack_100._M_single_bucket = (__node_base_ptr)0x0;
      _Stack_118._M_h = (__hashtable_alloc *)&_Stack_100;
      std::
      _Hashtable<int,std::pair<int_const,float>,std::allocator<std::pair<int_const,float>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<int,std::pair<int_const,float>,std::allocator<std::pair<int_const,float>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,float>,false>>>>
                ((_Hashtable<int,std::pair<int_const,float>,std::allocator<std::pair<int_const,float>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&_Stack_100,&(pEVar6->cacheLatency)._M_h,&_Stack_118);
      _Stack_c8._M_buckets = (__buckets_ptr)0x0;
      _Stack_c8._M_bucket_count = (pEVar6->requests)._M_h._M_bucket_count;
      _Stack_c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      _Stack_c8._M_element_count = (pEVar6->requests)._M_h._M_element_count;
      _Stack_c8._M_rehash_policy._M_max_load_factor =
           (pEVar6->requests)._M_h._M_rehash_policy._M_max_load_factor;
      _Stack_c8._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pEVar6->requests)._M_h._M_rehash_policy.field_0x4;
      _Stack_c8._M_rehash_policy._M_next_resize =
           (pEVar6->requests)._M_h._M_rehash_policy._M_next_resize;
      _Stack_c8._M_single_bucket = (__node_base_ptr)0x0;
      _Stack_118._M_h = (__hashtable_alloc *)&_Stack_c8;
      std::
      _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,int>,false>>>>
                ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&_Stack_c8,&(pEVar6->requests)._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_int>,_false>_>_>
                  *)&_Stack_118);
      fStack_90 = pEVar6->serverLatency;
      if (_Stack_c8._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        iVar4 = pGVar5->numberOfRequests;
        _Var2._M_nxt = _Stack_c8._M_before_begin._M_nxt;
        do {
          iVar4 = iVar4 + *(int *)((long)&_Var2._M_nxt[1]._M_nxt + 4);
          _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt;
        } while (_Var2._M_nxt != (_Hash_node_base *)0x0);
        pGVar5->numberOfRequests = iVar4;
      }
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_c8);
      std::
      _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_100);
      pEVar6 = pEVar6 + 1;
      pEVar3 = extraout_RAX;
    } while (pEVar6 != pEStack_110);
  }
  return (int)pEVar3;
}

Assistant:

void GeneticAlgorithm::init(int generations, DataCenter dataCenter) {
    this->dataCenter = dataCenter ;
    srand (time(NULL));
    findNumberOfRequests();
    this->population = std::vector<std::vector<std::string>>(POPULATION_SIZE * 2);
    this->generateInitialPopulation(POPULATION_SIZE);
    for (int i = 0; i < generations; ++i) {
        std::cout << "Geração " << i << std::endl;
     //   std::cout << "Iniciando Cross" << std::endl;
        crossover();
      //  std::cout << "Iniciando Mut" << std::endl;

        mutation();
      //  std::cout << "Iniciando Sel" << std::endl;

        selection();
    }
    std::cout << "Pop Size" << this->population.size() << " "  << std::endl;

    for (std::vector<std::string> strings : this->population) {
        for(std::string string : strings){
            std::cout << string << " " ;
        }

        std::cout << std::endl;
        fitness(strings);
    }
    std::cout << "Best : " ;
    for(std::string string : bestSolution){
        std::cout << string << " " ;
    }

    std::cout << std::endl;
    std::cout << "Fitness == " << fitness(bestSolution) * -1 * 1000<< std::endl;

}